

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

Long __thiscall amrex::BoxArray::numPts(BoxArray *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  Long LVar5;
  byte bVar6;
  int iVar7;
  BATransformer *in_RDI;
  IntVect IVar8;
  int i_2;
  Box result_1;
  Box bx;
  int i_1;
  IntVect cr;
  IndexType t;
  int i;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *bxs;
  int N;
  Long result;
  int dir;
  IntVect off;
  int off_1;
  uint bitval;
  uint typ;
  int dir_1;
  BoxArray *in_stack_fffffffffffffc28;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_fffffffffffffc30;
  BoxArray *in_stack_fffffffffffffc40;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int local_394;
  int local_390;
  int local_38c;
  int local_37c;
  int local_378;
  int local_374;
  int local_36c;
  int local_368;
  int local_364;
  int local_35c;
  int local_358;
  int local_354;
  int local_344;
  int local_340;
  int local_33c;
  int local_334;
  int local_330;
  int local_32c;
  int local_324;
  int local_320;
  int local_31c;
  Box *in_stack_fffffffffffffcf8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  BATbndryReg *in_stack_fffffffffffffd00;
  int local_2c8;
  undefined8 local_2c4;
  undefined8 local_2bc;
  undefined8 local_2b4;
  uint local_2ac;
  Box local_2a8;
  int local_28c;
  int local_288 [3];
  undefined8 local_274;
  int local_26c;
  uint local_268;
  int local_264;
  element_type *local_260;
  int local_254;
  long local_250;
  uint local_23c;
  uint *local_238;
  undefined8 *local_230;
  int *local_228;
  Box *local_220;
  int local_218;
  IntVect local_214;
  int *local_208;
  undefined8 *local_200;
  int local_1f8;
  uint local_1f4;
  uint local_1f0;
  int local_1ec;
  Box *local_1e8;
  uint local_1dc;
  uint local_1d8;
  int local_1d4;
  IndexType *local_1d0;
  int local_1c4;
  long local_1c0;
  int local_1b4;
  int *local_1b0;
  IntVect *local_1a8;
  int *local_1a0;
  undefined4 local_194;
  IntVect *local_190;
  undefined4 local_184;
  IntVect *local_180;
  undefined4 local_174;
  IntVect *local_170;
  undefined4 local_164;
  int *local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  long local_140;
  int *local_138;
  undefined8 *local_130;
  uint *local_128;
  int local_11c;
  IndexType *local_118;
  int local_10c;
  uint *local_108;
  int local_fc;
  uint *local_f8;
  undefined4 local_f0;
  int local_ec;
  IntVect *local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  uint *local_70;
  int local_64;
  uint *local_60;
  int local_54;
  IndexType *local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  IntVect *local_30;
  int local_24;
  IndexType *local_20;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  local_250 = 0;
  LVar5 = size((BoxArray *)0x1253a90);
  local_254 = (int)LVar5;
  local_260 = std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1253aa8);
  bVar4 = BATransformer::is_null(in_RDI);
  if (bVar4) {
    for (local_264 = 0; local_264 < local_254; local_264 = local_264 + 1) {
      Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
      LVar5 = Box::numPts((Box *)in_stack_fffffffffffffc40);
      local_250 = LVar5 + local_250;
    }
  }
  else {
    bVar4 = BATransformer::is_simple(in_RDI);
    if (bVar4) {
      local_268 = (uint)ixType(in_stack_fffffffffffffc28);
      IVar8 = crseRatio(in_stack_fffffffffffffc40);
      local_288._0_8_ = IVar8.vect._0_8_;
      local_274._0_4_ = local_288[0];
      local_274._4_4_ = local_288[1];
      local_288[2] = IVar8.vect[2];
      local_26c = local_288[2];
      local_288 = IVar8.vect;
      for (local_28c = 0; local_28c < local_254; local_28c = local_28c + 1) {
        local_220 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                              (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
        local_228 = (int *)&local_274;
        lVar2 = *(long *)(local_220->smallend).vect;
        local_2bc = *(long *)((local_220->smallend).vect + 2);
        lVar3 = *(long *)((local_220->bigend).vect + 1);
        uVar1 = (local_220->btype).itype;
        puVar9 = &local_2c4;
        local_164 = 1;
        bVar4 = true;
        if (((int)local_274 == 1) && (bVar4 = true, local_274._4_4_ == 1)) {
          bVar4 = local_26c != 1;
        }
        local_2c4 = lVar2;
        local_2b4 = lVar3;
        local_208 = local_228;
        local_200 = puVar9;
        local_160 = local_228;
        if (bVar4) {
          local_2c4._0_4_ = (int)lVar2;
          local_c4 = (int)local_2c4;
          local_c8 = (int)local_274;
          local_c0 = local_c4;
          if ((int)local_274 != 1) {
            if ((int)local_274 == 2) {
              if ((int)local_2c4 < 0) {
                iVar7 = (int)local_2c4 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_31c = -iVar7 / 2 + -1;
              }
              else {
                local_31c = (int)local_2c4 / 2;
              }
              local_c0 = local_31c;
            }
            else if ((int)local_274 == 4) {
              if ((int)local_2c4 < 0) {
                iVar7 = (int)local_2c4 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_320 = -iVar7 / 4 + -1;
              }
              else {
                local_320 = (int)local_2c4 / 4;
              }
              local_c0 = local_320;
            }
            else {
              if ((int)local_2c4 < 0) {
                iVar7 = (int)local_2c4 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_324 = -iVar7 / (int)local_274 + -1;
              }
              else {
                local_324 = (int)local_2c4 / (int)local_274;
              }
              local_c0 = local_324;
            }
          }
          local_2c4._4_4_ = (int)((ulong)lVar2 >> 0x20);
          local_d0 = local_2c4._4_4_;
          local_2c4._0_4_ = local_c0;
          local_d4 = local_274._4_4_;
          local_cc = local_d0;
          if (local_274._4_4_ != 1) {
            if (local_274._4_4_ == 2) {
              if (lVar2 < 0) {
                iVar7 = local_d0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_32c = -iVar7 / 2 + -1;
              }
              else {
                local_32c = local_d0 / 2;
              }
              local_cc = local_32c;
            }
            else if (local_274._4_4_ == 4) {
              if (lVar2 < 0) {
                iVar7 = local_d0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_330 = -iVar7 / 4 + -1;
              }
              else {
                local_330 = local_d0 / 4;
              }
              local_cc = local_330;
            }
            else {
              if (lVar2 < 0) {
                iVar7 = local_d0 + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_334 = -iVar7 / local_274._4_4_ + -1;
              }
              else {
                local_334 = local_d0 / local_274._4_4_;
              }
              local_cc = local_334;
            }
          }
          local_2c4._4_4_ = local_cc;
          local_dc = (int)local_2bc;
          local_e0 = local_26c;
          local_d8 = local_dc;
          if (local_26c != 1) {
            if (local_26c == 2) {
              if ((int)local_2bc < 0) {
                iVar7 = (int)local_2bc + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_33c = -iVar7 / 2 + -1;
              }
              else {
                local_33c = (int)local_2bc / 2;
              }
              local_d8 = local_33c;
            }
            else if (local_26c == 4) {
              if ((int)local_2bc < 0) {
                iVar7 = (int)local_2bc + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_340 = -iVar7 / 4 + -1;
              }
              else {
                local_340 = (int)local_2bc / 4;
              }
              local_d8 = local_340;
            }
            else {
              if ((int)local_2bc < 0) {
                iVar7 = (int)local_2bc + 1;
                if (iVar7 < 1) {
                  iVar7 = -iVar7;
                }
                local_344 = -iVar7 / local_26c + -1;
              }
              else {
                local_344 = (int)local_2bc / local_26c;
              }
              local_d8 = local_344;
            }
          }
          local_2bc._0_4_ = local_d8;
          local_128 = &local_2ac;
          local_138 = local_228;
          local_130 = puVar9;
          if (local_2ac == 0) {
            local_140 = (long)&local_2bc + 4;
            local_a0 = local_2bc._4_4_;
            local_a4 = (int)local_274;
            local_9c = local_a0;
            if ((int)local_274 != 1) {
              if ((int)local_274 == 2) {
                if (local_2bc < 0) {
                  iVar7 = local_2bc._4_4_ + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_38c = -iVar7 / 2 + -1;
                }
                else {
                  local_38c = local_2bc._4_4_ / 2;
                }
                local_9c = local_38c;
              }
              else if ((int)local_274 == 4) {
                if (local_2bc < 0) {
                  iVar7 = local_2bc._4_4_ + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_390 = -iVar7 / 4 + -1;
                }
                else {
                  local_390 = local_2bc._4_4_ / 4;
                }
                local_9c = local_390;
              }
              else {
                if (local_2bc < 0) {
                  iVar7 = local_2bc._4_4_ + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_394 = -iVar7 / (int)local_274 + -1;
                }
                else {
                  local_394 = local_2bc._4_4_ / (int)local_274;
                }
                local_9c = local_394;
              }
            }
            local_2bc._4_4_ = local_9c;
            local_2b4._0_4_ = (int)lVar3;
            local_ac = (int)local_2b4;
            local_b0 = local_274._4_4_;
            local_a8 = local_ac;
            if (local_274._4_4_ != 1) {
              if (local_274._4_4_ == 2) {
                if ((int)local_2b4 < 0) {
                  iVar7 = (int)local_2b4 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_39c = -iVar7 / 2 + -1;
                }
                else {
                  local_39c = (int)local_2b4 / 2;
                }
                local_a8 = local_39c;
              }
              else if (local_274._4_4_ == 4) {
                if ((int)local_2b4 < 0) {
                  iVar7 = (int)local_2b4 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_3a0 = -iVar7 / 4 + -1;
                }
                else {
                  local_3a0 = (int)local_2b4 / 4;
                }
                local_a8 = local_3a0;
              }
              else {
                if ((int)local_2b4 < 0) {
                  iVar7 = (int)local_2b4 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_3a4 = -iVar7 / local_274._4_4_ + -1;
                }
                else {
                  local_3a4 = (int)local_2b4 / local_274._4_4_;
                }
                local_a8 = local_3a4;
              }
            }
            local_2b4._4_4_ = (int)((ulong)lVar3 >> 0x20);
            local_b8 = local_2b4._4_4_;
            local_2b4._0_4_ = local_a8;
            local_bc = local_26c;
            local_b4 = local_b8;
            if (local_26c != 1) {
              if (local_26c == 2) {
                if (lVar3 < 0) {
                  iVar7 = local_b8 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_3ac = -iVar7 / 2 + -1;
                }
                else {
                  local_3ac = local_b8 / 2;
                }
                local_b4 = local_3ac;
              }
              else if (local_26c == 4) {
                if (lVar3 < 0) {
                  iVar7 = local_b8 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_3b0 = -iVar7 / 4 + -1;
                }
                else {
                  local_3b0 = local_b8 / 4;
                }
                local_b4 = local_3b0;
              }
              else {
                if (lVar3 < 0) {
                  iVar7 = local_b8 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_3b4 = -iVar7 / local_26c + -1;
                }
                else {
                  local_3b4 = local_b8 / local_26c;
                }
                local_b4 = local_3b4;
              }
            }
            local_2b4._4_4_ = local_b4;
            local_2b4 = local_2b4;
            local_148 = local_228;
          }
          else {
            local_2ac = uVar1;
            IntVect::IntVect(&local_214,0);
            for (local_218 = 0; local_218 < 3; local_218 = local_218 + 1) {
              local_f8 = (uint *)(puVar9 + 3);
              local_fc = local_218;
              local_74 = local_218;
              local_3c = local_218;
              if ((*local_f8 & 1 << ((byte)local_218 & 0x1f)) != 0) {
                local_1c0 = (long)puVar9 + 0xc;
                local_1c4 = local_218;
                local_1b0 = local_208;
                local_1b4 = local_218;
                if (*(int *)(local_1c0 + (long)local_218 * 4) % local_208[local_218] != 0) {
                  local_e8 = &local_214;
                  local_ec = local_218;
                  local_f0 = 1;
                  local_e8->vect[local_218] = 1;
                }
              }
              local_70 = local_f8;
            }
            local_150 = (int *)((long)puVar9 + 0xc);
            local_158 = local_208;
            local_7c = *local_150;
            local_80 = *local_208;
            local_78 = local_7c;
            if (local_80 != 1) {
              if (local_80 == 2) {
                if (local_7c < 0) {
                  iVar7 = local_7c + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_354 = -iVar7 / 2 + -1;
                }
                else {
                  local_354 = local_7c / 2;
                }
                local_78 = local_354;
              }
              else if (local_80 == 4) {
                if (local_7c < 0) {
                  iVar7 = local_7c + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_358 = -iVar7 / 4 + -1;
                }
                else {
                  local_358 = local_7c / 4;
                }
                local_78 = local_358;
              }
              else {
                if (local_7c < 0) {
                  iVar7 = local_7c + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_35c = -iVar7 / local_80 + -1;
                }
                else {
                  local_35c = local_7c / local_80;
                }
                local_78 = local_35c;
              }
            }
            puVar10 = puVar9;
            *local_150 = local_78;
            local_88 = *(int *)(puVar9 + 2);
            local_8c = local_158[1];
            local_84 = local_88;
            if (local_8c != 1) {
              if (local_8c == 2) {
                if (local_88 < 0) {
                  iVar7 = local_88 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_364 = -iVar7 / 2 + -1;
                }
                else {
                  local_364 = local_88 / 2;
                }
                local_84 = local_364;
              }
              else if (local_8c == 4) {
                if (local_88 < 0) {
                  iVar7 = local_88 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_368 = -iVar7 / 4 + -1;
                }
                else {
                  local_368 = local_88 / 4;
                }
                local_84 = local_368;
              }
              else {
                if (local_88 < 0) {
                  iVar7 = local_88 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_36c = -iVar7 / local_8c + -1;
                }
                else {
                  local_36c = local_88 / local_8c;
                }
                local_84 = local_36c;
              }
            }
            *(int *)(puVar9 + 2) = local_84;
            local_94 = *(int *)((long)puVar9 + 0x14);
            local_98 = local_158[2];
            local_90 = local_94;
            if (local_98 != 1) {
              if (local_98 == 2) {
                if (local_94 < 0) {
                  iVar7 = local_94 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_374 = -iVar7 / 2 + -1;
                }
                else {
                  local_374 = local_94 / 2;
                }
                local_90 = local_374;
              }
              else if (local_98 == 4) {
                if (local_94 < 0) {
                  iVar7 = local_94 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_378 = -iVar7 / 4 + -1;
                }
                else {
                  local_378 = local_94 / 4;
                }
                local_90 = local_378;
              }
              else {
                if (local_94 < 0) {
                  iVar7 = local_94 + 1;
                  if (iVar7 < 1) {
                    iVar7 = -iVar7;
                  }
                  local_37c = -iVar7 / local_98 + -1;
                }
                else {
                  local_37c = local_94 / local_98;
                }
                local_90 = local_37c;
              }
            }
            *(int *)((long)puVar9 + 0x14) = local_90;
            local_1a0 = (int *)((long)puVar10 + 0xc);
            local_1a8 = &local_214;
            local_174 = 0;
            local_170 = local_1a8;
            *local_1a0 = local_214.vect[0] + *local_1a0;
            local_180 = local_1a8;
            local_184 = 1;
            *(int *)(puVar10 + 2) = local_1a8->vect[1] + *(int *)(puVar10 + 2);
            local_190 = local_1a8;
            local_194 = 2;
            *(int *)((long)puVar10 + 0x14) = local_1a8->vect[2] + *(int *)((long)puVar10 + 0x14);
            uVar1 = local_2ac;
          }
        }
        local_2ac = uVar1;
        local_230 = &local_2c4;
        local_238 = &local_268;
        local_2a8.smallend.vect._0_8_ = local_2c4;
        local_2a8._8_8_ = local_2bc;
        local_2a8.btype.itype = local_2ac;
        local_23c = local_268;
        local_1e8 = &local_2a8;
        for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
          local_108 = &local_1dc;
          local_10c = local_1ec;
          local_64 = local_1ec;
          local_40 = local_1ec;
          bVar6 = (byte)local_1ec;
          local_1f0 = (uint)((local_268 & 1 << (bVar6 & 0x1f)) != 0);
          local_118 = &local_2a8.btype;
          local_11c = local_1ec;
          local_54 = local_1ec;
          local_44 = local_1ec;
          local_1f4 = (uint)((local_2a8.btype.itype & 1 << (bVar6 & 0x1f)) != 0);
          local_1f8 = local_1f0 - local_1f4;
          local_30 = &local_2a8.bigend;
          local_34 = local_1ec;
          local_30->vect[local_1ec] = local_1f8 + local_30->vect[local_1ec];
          local_1d0 = &local_2a8.btype;
          local_1d4 = local_1ec;
          if (local_1f0 == 0) {
            local_24 = local_1ec;
            local_18 = local_1ec;
            local_2a8.btype.itype = (1 << (bVar6 & 0x1f) ^ 0xffffffffU) & local_2a8.btype.itype;
            local_20 = local_1d0;
          }
          else {
            local_14 = local_1ec;
            local_4 = local_1ec;
            local_2a8.btype.itype = 1 << (bVar6 & 0x1f) | local_2a8.btype.itype;
            local_10 = local_1d0;
          }
          local_1d8 = local_1f0;
          local_60 = local_108;
          local_50 = local_118;
          local_38 = local_1f8;
        }
        local_2a8.bigend.vect._4_8_ = local_2b4;
        local_1dc = local_23c;
        LVar5 = Box::numPts(local_1e8);
        local_250 = LVar5 + local_250;
      }
    }
    else {
      for (local_2c8 = 0; local_2c8 < local_254; local_2c8 = local_2c8 + 1) {
        Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                  ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)&(in_RDI->m_op).m_indexType,
                   (size_type)in_stack_fffffffffffffc28);
        BATbndryReg::operator()(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        LVar5 = Box::numPts((Box *)in_stack_fffffffffffffc40);
        local_250 = LVar5 + local_250;
      }
    }
  }
  return local_250;
}

Assistant:

Long
BoxArray::numPts () const noexcept
{
    Long result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).numPts();
        }
    }

    return result;
}